

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_CopyRectIn_Test::TestBody(Image_CopyRectIn_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  pointer pbVar3;
  bool bVar4;
  Allocator alloc;
  byte bVar5;
  uint nc;
  char *pcVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  Point2i p;
  int c;
  uint uVar8;
  long lVar9;
  Tuple2<pbrt::Point2,_int> p_00;
  int x;
  int iVar10;
  ulong uVar11;
  PixelFormat format;
  float *pfVar12;
  Float *pFVar13;
  undefined1 auVar14 [16];
  Float FVar15;
  undefined1 in_ZMM3 [64];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> buf_00;
  AssertionResult gtest_ar_;
  Float qv;
  Bounds2i extent;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> buf;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  Image image;
  Message local_230;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  PixelFormat local_21c;
  AssertHelper local_218;
  Float local_210 [3];
  int local_204;
  Bounds2i local_200;
  string local_1f0;
  long local_1d0;
  ulong local_1c8;
  Tuple2<pbrt::Point2,_int> local_1c0;
  vector<float,_std::allocator<float>_> local_1b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1a0;
  long local_180;
  ColorEncodingHandle local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  PixelFormat local_154 [3];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148 [2];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  polymorphic_allocator<unsigned_char> local_90;
  uchar *local_88;
  size_t local_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  Half *local_68;
  size_t local_60;
  size_t local_58;
  polymorphic_allocator<float> local_50;
  float *local_48;
  size_t local_40;
  size_t local_38;
  
  local_1d0 = 0;
  local_154[0] = U256;
  local_154[1] = Half;
  local_1c8 = 0x853c49e6748fea9b;
  local_154[2] = 2;
  do {
    local_204 = 0;
    nc = 1;
    format = *(PixelFormat *)((long)local_154 + local_1d0);
    local_21c = format;
    do {
      GetFloatPixels(&local_1a0,(Point2i)0x2000000011,nc);
      local_148[0] = &local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"A","");
      __l._M_len = 1;
      __l._M_array = (iterator)local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_170,__l,(allocator_type *)&local_1f0);
      if (local_148[0] != &local_138) {
        operator_delete(local_148[0],
                        (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource + 1))
        ;
      }
      iVar10 = local_204;
      if (1 < nc) {
        do {
          local_148[0] = &local_138;
          std::__cxx11::string::_M_construct((ulong)local_148,'\x01');
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_170
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148
                    );
          if (local_148[0] != &local_138) {
            operator_delete(local_148[0],
                            (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource +
                                   1));
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      pbVar3 = local_170.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)local_170.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_170.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_178.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )pbrt::ColorEncodingHandle::Linear.bits;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar9 >> 5;
      channels.ptr = pbVar3;
      pbrt::Image::Image((Image *)local_148,format,(Point2i)0x2000000011,channels,&local_178,alloc);
      lVar9 = 0;
      pfVar12 = local_1a0.ptr;
      do {
        local_1c0 = (Tuple2<pbrt::Point2,_int>)(lVar9 << 0x20);
        uVar11 = 0;
        local_180 = lVar9;
        do {
          uVar8 = 0;
          p.super_Tuple2<pbrt::Point2,_int> = local_1c0 | uVar11;
          do {
            pbrt::Image::SetChannel((Image *)local_148,p,uVar8,*pfVar12);
            uVar8 = uVar8 + 1;
            pfVar12 = pfVar12 + 1;
          } while (nc != uVar8);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x11);
        lVar9 = local_180 + 1;
      } while (lVar9 != 0x20);
      local_200.pMin.super_Tuple2<pbrt::Point2,_int>.x = 10;
      local_200.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x17;
      local_200.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0x11;
      local_200.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0x1c;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1b8,(long)(int)(nc * 0x23),(allocator_type *)&local_1f0);
      format = local_21c;
      for (pFVar13 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pFVar13 !=
          local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish; pFVar13 = pFVar13 + 1) {
        uVar8 = (uint)(local_1c8 >> 0x2d) ^ (uint)(local_1c8 >> 0x1b);
        bVar5 = (byte)(local_1c8 >> 0x3b);
        auVar14 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar8 >> bVar5 | uVar8 << 0x20 - bVar5);
        local_1c8 = local_1c8 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        auVar14 = vminss_avx(ZEXT416((uint)(auVar14._0_4_ * 2.3283064e-10)),
                             SUB6416(ZEXT464(0x3f7fffff),0));
        *pFVar13 = auVar14._0_4_;
      }
      buf_00.n = (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      buf_00.ptr = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      pbrt::Image::CopyRectIn((Image *)local_148,&local_200,buf_00);
      bVar4 = true;
      if ((local_200.pMin.super_Tuple2<pbrt::Point2,_int>.x <
           local_200.pMax.super_Tuple2<pbrt::Point2,_int>.x) &&
         (p_00 = local_200.pMin.super_Tuple2<pbrt::Point2,_int>,
         pFVar13 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
         local_200.pMin.super_Tuple2<pbrt::Point2,_int>.y <
         local_200.pMax.super_Tuple2<pbrt::Point2,_int>.y)) {
        do {
          uVar8 = 0;
          TVar7 = p_00;
          local_1c0 = p_00;
          do {
            local_230.ss_.ptr_._0_4_ =
                 (Float)CONCAT31(local_230.ss_.ptr_._1_3_,
                                 pFVar13 !=
                                 local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish);
            local_228.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (pFVar13 ==
                local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              testing::Message::Message((Message *)&local_218);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_1f0,(internal *)&local_230,(AssertionResult *)"bufIter == buf.end()"
                         ,"true","false",(char *)TVar7);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_210,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x121,(char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                                 (char)local_1f0._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_210,(Message *)&local_218);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) !=
                  &local_1f0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                         (char)local_1f0._M_dataplus._M_p),
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              format = local_21c;
              if (((local_218.data_ != (AssertHelperData *)0x0) &&
                  (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 (local_218.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_218.data_ + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_228,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              bVar4 = false;
              goto LAB_0030ba52;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_228,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (local_21c == U256) {
              FVar15 = pbrt::Image::GetChannel
                                 ((Image *)local_148,(Point2i)p_00,uVar8,(WrapMode2D)0x200000002);
              in_ZMM3 = ZEXT1664(ZEXT816(0) << 0x40);
              local_230.ss_.ptr_._0_4_ = 0.0019647058;
              auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)*pFVar13));
              uVar1 = vcmpss_avx512f(ZEXT416((uint)*pFVar13),ZEXT816(0) << 0x40,1);
              auVar2._8_4_ = 0x7fffffff;
              auVar2._0_8_ = 0x7fffffff7fffffff;
              auVar2._12_4_ = 0x7fffffff;
              auVar14 = vandps_avx512vl(ZEXT416((uint)(FVar15 - (float)((uint)!(bool)((byte)uVar1 &
                                                                                     1) *
                                                                       auVar14._0_4_))),auVar2);
              local_210[0] = auVar14._0_4_;
              testing::internal::CmpHelperLT<float,float>
                        ((internal *)&local_1f0,"err","0.501f / 255.f",local_210,(float *)&local_230
                        );
              if ((char)local_1f0._M_dataplus._M_p == '\0') {
                testing::Message::Message(&local_230);
                pcVar6 = "";
                if ((undefined8 *)local_1f0._M_string_length != (undefined8 *)0x0) {
                  pcVar6 = *(char **)local_1f0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_218,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0x125,pcVar6);
                testing::internal::AssertHelper::operator=(&local_218,&local_230);
                testing::internal::AssertHelper::~AssertHelper(&local_218);
                if (((CONCAT44(local_230.ss_.ptr_._4_4_,local_230.ss_.ptr_._0_4_) != 0) &&
                    (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                   ((long *)CONCAT44(local_230.ss_.ptr_._4_4_,local_230.ss_.ptr_._0_4_) !=
                    (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_230.ss_.ptr_._4_4_,local_230.ss_.ptr_._0_4_)
                              + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1f0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              local_210[0] = modelQuantization(*pFVar13,local_21c);
              local_230.ss_.ptr_._0_4_ =
                   pbrt::Image::GetChannel
                             ((Image *)local_148,(Point2i)p_00,uVar8,(WrapMode2D)0x200000002);
              testing::internal::CmpHelperEQ<float,float>
                        ((internal *)&local_1f0,"qv","image.GetChannel(*pIter, c)",local_210,
                         (float *)&local_230);
              if ((char)local_1f0._M_dataplus._M_p == '\0') {
                testing::Message::Message(&local_230);
                pcVar6 = "";
                if ((undefined8 *)local_1f0._M_string_length != (undefined8 *)0x0) {
                  pcVar6 = *(char **)local_1f0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_218,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0x128,pcVar6);
                testing::internal::AssertHelper::operator=(&local_218,&local_230);
                testing::internal::AssertHelper::~AssertHelper(&local_218);
                if (((CONCAT44(local_230.ss_.ptr_._4_4_,local_230.ss_.ptr_._0_4_) != 0) &&
                    (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                   ((long *)CONCAT44(local_230.ss_.ptr_._4_4_,local_230.ss_.ptr_._0_4_) !=
                    (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_230.ss_.ptr_._4_4_,local_230.ss_.ptr_._0_4_)
                              + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1f0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            pFVar13 = pFVar13 + 1;
            uVar8 = uVar8 + 1;
          } while (nc != uVar8);
          uVar8 = local_1c0.x + 1;
          TVar7 = (Tuple2<pbrt::Point2,_int>)
                  (((ulong)p_00 & 0xffffffff00000000 |
                   (ulong)local_200.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff) + 0x100000000
                  );
          if (uVar8 != local_200.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
            TVar7 = (Tuple2<pbrt::Point2,_int>)(((ulong)p_00 & 0xffffffff00000000) + (ulong)uVar8);
          }
          iVar10 = local_200.pMax.super_Tuple2<pbrt::Point2,_int>.y;
          if (local_200.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
              local_200.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
              local_200.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
              local_200.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
            iVar10 = local_200.pMin.super_Tuple2<pbrt::Point2,_int>.y;
          }
          p_00 = TVar7;
        } while ((local_200.pMin.super_Tuple2<pbrt::Point2,_int>.x != TVar7.x) ||
                (iVar10 != TVar7.y));
        bVar4 = true;
        format = local_21c;
      }
LAB_0030ba52:
      if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (Float *)0x0) {
        operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_38 = 0;
      (*(local_50.memoryResource)->_vptr_memory_resource[3])
                (local_50.memoryResource,local_48,local_40 << 2,4);
      local_58 = 0;
      (*(local_70.memoryResource)->_vptr_memory_resource[3])
                (local_70.memoryResource,local_68,local_60 * 2,2);
      local_78 = 0;
      (*(local_90.memoryResource)->_vptr_memory_resource[3])
                (local_90.memoryResource,local_88,local_80,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      local_1a0.nStored = 0;
      (*(local_1a0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1a0.alloc.memoryResource,local_1a0.ptr,local_1a0.nAlloc << 2,4);
      if (!bVar4) {
        return;
      }
      local_204 = local_204 + 1;
      nc = nc + 1;
    } while (nc != 4);
    local_1d0 = local_1d0 + 4;
    if (local_1d0 == 0xc) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Image, CopyRectIn) {
    Point2i res(17, 32);
    RNG rng;

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);
            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(10, 23), Point2i(17, 28));
            std::vector<float> buf(extent.Area() * nc);
            std::generate(buf.begin(), buf.end(),
                          [&rng]() { return rng.Uniform<Float>(); });

            image.CopyRectIn(extent, buf);

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    if (format == PixelFormat::U256) {
                        Float err =
                            std::abs(image.GetChannel(*pIter, c) - Clamp(*bufIter, 0, 1));
                        EXPECT_LT(err, 0.501f / 255.f);
                    } else {
                        Float qv = modelQuantization(*bufIter, format);
                        EXPECT_EQ(qv, image.GetChannel(*pIter, c));
                    }
                    ++bufIter;
                }
            }
        }
    }
}